

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTexture2DArray::TestTexture2DArray
          (TestTexture2DArray *this,CompressedTexFormat *format,int width,int height,int arraySize)

{
  uint uVar1;
  int iVar2;
  value_type local_88;
  uint local_60;
  uint local_5c;
  int layerNdx;
  int levelNdx;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> layers;
  TextureFormat local_2c;
  int local_24;
  int local_20;
  int arraySize_local;
  int height_local;
  int width_local;
  CompressedTexFormat *format_local;
  TestTexture2DArray *this_local;
  
  local_24 = arraySize;
  local_20 = height;
  arraySize_local = width;
  _height_local = format;
  format_local = (CompressedTexFormat *)this;
  TestTexture::TestTexture(&this->super_TestTexture,format,width,height,arraySize);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTexture2DArray_01660e68;
  local_2c = tcu::getUncompressedFormat(*_height_local);
  tcu::Texture2DArray::Texture2DArray(&this->m_texture,&local_2c,arraySize_local,local_20,local_24);
  allocateLevels<tcu::Texture2DArray>(&this->m_texture);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  local_5c = 0;
  while( true ) {
    uVar1 = local_5c;
    iVar2 = tcu::TextureLevelPyramid::getNumLevels(&(this->m_texture).super_TextureLevelPyramid);
    if (iVar2 <= (int)uVar1) break;
    local_60 = 0;
    while( true ) {
      uVar1 = local_60;
      iVar2 = tcu::Texture2DArray::getNumLayers(&this->m_texture);
      if (iVar2 <= (int)uVar1) break;
      (*(this->super_TestTexture)._vptr_TestTexture[7])
                (&local_88,this,(ulong)local_5c,(ulong)local_60);
      std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::push_back
                ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                 &layerNdx,&local_88);
      local_60 = local_60 + 1;
    }
    local_5c = local_5c + 1;
  }
  TestTexture::populateCompressedLevels
            (&this->super_TestTexture,*_height_local,
             (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~vector
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  return;
}

Assistant:

TestTexture2DArray::TestTexture2DArray (const tcu::CompressedTexFormat& format, int width, int height, int arraySize)
	: TestTexture	(format, width, height, arraySize)
	, m_texture		(tcu::getUncompressedFormat(format), width, height, arraySize)
{
	allocateLevels(m_texture);

	std::vector<tcu::PixelBufferAccess> layers;
	for (int levelNdx = 0; levelNdx < m_texture.getNumLevels(); levelNdx++)
		for (int layerNdx = 0; layerNdx < m_texture.getNumLayers(); layerNdx++)
			layers.push_back(getLevel(levelNdx, layerNdx));

	TestTexture::populateCompressedLevels(format, layers);
}